

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawChannel *pIVar1;
  unsigned_short *__src;
  ImDrawChannel *pIVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  ulong uVar9;
  ImDrawCmd *pIVar10;
  long lVar11;
  ImDrawCmd *pIVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar22 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  iVar17 = 0;
  if (0 < this->_Count) {
    lVar13 = (long)(draw_list->CmdBuffer).Size;
    iVar22 = 0;
    if (lVar13 < 1) {
LAB_001c7ea5:
      pIVar10 = (ImDrawCmd *)0x0;
      uVar20 = 0;
    }
    else {
      pIVar12 = (draw_list->CmdBuffer).Data;
      pIVar10 = pIVar12 + lVar13 + -1;
      if (pIVar10 == (ImDrawCmd *)0x0) goto LAB_001c7ea5;
      uVar20 = pIVar12[lVar13 + -1].ElemCount + pIVar12[lVar13 + -1].IdxOffset;
    }
    if (this->_Count != 1) {
      lVar13 = 1;
      iVar17 = 0;
      iVar22 = 0;
      do {
        if ((this->_Channels).Size <= lVar13) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar1 = (this->_Channels).Data;
        pIVar2 = pIVar1 + lVar13;
        iVar18 = pIVar1[lVar13]._CmdBuffer.Size;
        uVar9 = (ulong)iVar18;
        if ((long)uVar9 < 1) {
LAB_001c7fcc:
          iVar16 = (pIVar2->_IdxBuffer).Size;
        }
        else {
          if ((pIVar2->_CmdBuffer).Data[uVar9 - 1].ElemCount == 0) {
            uVar9 = (ulong)(iVar18 - 1U);
            (pIVar2->_CmdBuffer).Size = iVar18 - 1U;
          }
          if (((int)uVar9 == 0) || (pIVar10 == (ImDrawCmd *)0x0)) {
LAB_001c7f9c:
            iVar18 = (int)uVar9;
            if (iVar18 < 1) goto LAB_001c7fcc;
          }
          else {
            pIVar12 = (pIVar2->_CmdBuffer).Data;
            auVar25[0] = -(*(char *)&(pIVar12->ClipRect).x == *(char *)&(pIVar10->ClipRect).x);
            auVar25[1] = -(*(char *)((long)&(pIVar12->ClipRect).x + 1) ==
                          *(char *)((long)&(pIVar10->ClipRect).x + 1));
            auVar25[2] = -(*(char *)((long)&(pIVar12->ClipRect).x + 2) ==
                          *(char *)((long)&(pIVar10->ClipRect).x + 2));
            auVar25[3] = -(*(char *)((long)&(pIVar12->ClipRect).x + 3) ==
                          *(char *)((long)&(pIVar10->ClipRect).x + 3));
            auVar25[4] = -(*(char *)&(pIVar12->ClipRect).y == *(char *)&(pIVar10->ClipRect).y);
            auVar25[5] = -(*(char *)((long)&(pIVar12->ClipRect).y + 1) ==
                          *(char *)((long)&(pIVar10->ClipRect).y + 1));
            auVar25[6] = -(*(char *)((long)&(pIVar12->ClipRect).y + 2) ==
                          *(char *)((long)&(pIVar10->ClipRect).y + 2));
            auVar25[7] = -(*(char *)((long)&(pIVar12->ClipRect).y + 3) ==
                          *(char *)((long)&(pIVar10->ClipRect).y + 3));
            auVar25[8] = -(*(char *)&(pIVar12->ClipRect).z == *(char *)&(pIVar10->ClipRect).z);
            auVar25[9] = -(*(char *)((long)&(pIVar12->ClipRect).z + 1) ==
                          *(char *)((long)&(pIVar10->ClipRect).z + 1));
            auVar25[10] = -(*(char *)((long)&(pIVar12->ClipRect).z + 2) ==
                           *(char *)((long)&(pIVar10->ClipRect).z + 2));
            auVar25[0xb] = -(*(char *)((long)&(pIVar12->ClipRect).z + 3) ==
                            *(char *)((long)&(pIVar10->ClipRect).z + 3));
            auVar25[0xc] = -(*(char *)&(pIVar12->ClipRect).w == *(char *)&(pIVar10->ClipRect).w);
            auVar25[0xd] = -(*(char *)((long)&(pIVar12->ClipRect).w + 1) ==
                            *(char *)((long)&(pIVar10->ClipRect).w + 1));
            auVar25[0xe] = -(*(char *)((long)&(pIVar12->ClipRect).w + 2) ==
                            *(char *)((long)&(pIVar10->ClipRect).w + 2));
            auVar25[0xf] = -(*(char *)((long)&(pIVar12->ClipRect).w + 3) ==
                            *(char *)((long)&(pIVar10->ClipRect).w + 3));
            auVar23[0] = -(*(char *)&(pIVar12->ClipRect).w == *(char *)&(pIVar10->ClipRect).w);
            auVar23[1] = -(*(char *)((long)&(pIVar12->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar10->ClipRect).w + 1));
            auVar23[2] = -(*(char *)((long)&(pIVar12->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar10->ClipRect).w + 2));
            auVar23[3] = -(*(char *)((long)&(pIVar12->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar10->ClipRect).w + 3));
            auVar23[4] = -(*(char *)&pIVar12->TextureId == *(char *)&pIVar10->TextureId);
            auVar23[5] = -(*(char *)((long)&pIVar12->TextureId + 1) ==
                          *(char *)((long)&pIVar10->TextureId + 1));
            auVar23[6] = -(*(char *)((long)&pIVar12->TextureId + 2) ==
                          *(char *)((long)&pIVar10->TextureId + 2));
            auVar23[7] = -(*(char *)((long)&pIVar12->TextureId + 3) ==
                          *(char *)((long)&pIVar10->TextureId + 3));
            auVar23[8] = -(*(char *)((long)&pIVar12->TextureId + 4) ==
                          *(char *)((long)&pIVar10->TextureId + 4));
            auVar23[9] = -(*(char *)((long)&pIVar12->TextureId + 5) ==
                          *(char *)((long)&pIVar10->TextureId + 5));
            auVar23[10] = -(*(char *)((long)&pIVar12->TextureId + 6) ==
                           *(char *)((long)&pIVar10->TextureId + 6));
            auVar23[0xb] = -(*(char *)((long)&pIVar12->TextureId + 7) ==
                            *(char *)((long)&pIVar10->TextureId + 7));
            auVar23[0xc] = -((char)pIVar12->VtxOffset == (char)pIVar10->VtxOffset);
            auVar23[0xd] = -(*(char *)((long)&pIVar12->VtxOffset + 1) ==
                            *(char *)((long)&pIVar10->VtxOffset + 1));
            auVar23[0xe] = -(*(char *)((long)&pIVar12->VtxOffset + 2) ==
                            *(char *)((long)&pIVar10->VtxOffset + 2));
            auVar23[0xf] = -(*(char *)((long)&pIVar12->VtxOffset + 3) ==
                            *(char *)((long)&pIVar10->VtxOffset + 3));
            auVar23 = auVar23 & auVar25;
            if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) &&
               (pIVar12->UserCallback == (ImDrawCallback)0x0 &&
                pIVar10->UserCallback == (ImDrawCallback)0x0)) {
              pIVar10->ElemCount = pIVar10->ElemCount + pIVar12->ElemCount;
              uVar20 = uVar20 + pIVar12->ElemCount;
              memmove(pIVar12,pIVar12 + 1,(uVar9 & 0xffffffff) * 0x38 - 0x38);
              uVar8 = (pIVar2->_CmdBuffer).Size - 1;
              uVar9 = (ulong)uVar8;
              (pIVar2->_CmdBuffer).Size = uVar8;
              goto LAB_001c7f9c;
            }
          }
          pIVar12 = (pIVar2->_CmdBuffer).Data;
          iVar18 = (int)uVar9;
          uVar9 = uVar9 & 0xffffffff;
          pIVar10 = pIVar12 + (uVar9 - 1);
          iVar16 = (pIVar2->_IdxBuffer).Size;
          puVar15 = &pIVar12->ElemCount;
          do {
            puVar15[-1] = uVar20;
            uVar20 = uVar20 + *puVar15;
            puVar15 = puVar15 + 0xe;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        iVar22 = iVar22 + iVar16;
        iVar17 = iVar17 + iVar18;
        lVar13 = lVar13 + 1;
      } while (lVar13 < this->_Count);
    }
  }
  iVar16 = (draw_list->CmdBuffer).Size + iVar17;
  iVar18 = (draw_list->CmdBuffer).Capacity;
  if (iVar18 < iVar16) {
    if (iVar18 == 0) {
      iVar18 = 8;
    }
    else {
      iVar18 = iVar18 / 2 + iVar18;
    }
    if (iVar18 <= iVar16) {
      iVar18 = iVar16;
    }
    pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar18 * 0x38);
    pIVar12 = (draw_list->CmdBuffer).Data;
    if (pIVar12 != (ImDrawCmd *)0x0) {
      memcpy(pIVar10,pIVar12,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar10;
    (draw_list->CmdBuffer).Capacity = iVar18;
  }
  (draw_list->CmdBuffer).Size = iVar16;
  lVar13 = (long)(draw_list->IdxBuffer).Size + (long)iVar22;
  iVar18 = (draw_list->IdxBuffer).Capacity;
  iVar19 = (int)lVar13;
  if (iVar18 < iVar19) {
    if (iVar18 == 0) {
      iVar18 = 8;
    }
    else {
      iVar18 = iVar18 / 2 + iVar18;
    }
    if (iVar18 <= iVar19) {
      iVar18 = iVar19;
    }
    local_40 = (unsigned_short *)ImGui::MemAlloc((long)iVar18 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar18;
    iVar16 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar19;
  local_40 = local_40 + (lVar13 - iVar22);
  if (1 < this->_Count) {
    pIVar12 = (draw_list->CmdBuffer).Data + ((long)iVar16 - (long)iVar17);
    lVar21 = 1;
    lVar13 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar21) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar2 = (this->_Channels).Data;
      lVar11 = (long)*(int *)((long)pIVar2 + lVar13 + -0x18);
      if (lVar11 != 0) {
        memcpy(pIVar12,*(void **)((long)pIVar2 + lVar13 + -0x10),lVar11 * 0x38);
        pIVar12 = pIVar12 + lVar11;
      }
      lVar11 = (long)*(int *)((long)pIVar2 + lVar13 + -8);
      if (lVar11 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar13),lVar11 * 2);
        local_40 = local_40 + lVar11;
      }
      lVar21 = lVar21 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar21 < this->_Count);
    iVar16 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (iVar16 != 0) {
    if (iVar16 < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
      iVar16 = (draw_list->CmdBuffer).Size;
    }
    pIVar12 = (draw_list->CmdBuffer).Data;
    lVar13 = (long)iVar16;
    if (pIVar12[lVar13 + -1].UserCallback == (ImDrawCallback)0x0) goto LAB_001c8222;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar12 = (draw_list->CmdBuffer).Data;
  lVar13 = (long)(draw_list->CmdBuffer).Size;
LAB_001c8222:
  pIVar14 = pIVar12 + lVar13 + -1;
  pIVar10 = &draw_list->_CmdHeader;
  if (pIVar12[lVar13 + -1].ElemCount == 0) {
    fVar4 = (pIVar10->ClipRect).x;
    fVar5 = (pIVar10->ClipRect).y;
    fVar6 = (draw_list->_CmdHeader).ClipRect.z;
    fVar7 = (draw_list->_CmdHeader).ClipRect.w;
    uVar3 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar12[lVar13 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar12[lVar13 + -1].TextureId + 4) = uVar3;
    (pIVar14->ClipRect).x = fVar4;
    (pIVar14->ClipRect).y = fVar5;
    pIVar12[lVar13 + -1].ClipRect.z = fVar6;
    pIVar12[lVar13 + -1].ClipRect.w = fVar7;
  }
  else {
    auVar26[0] = -(*(char *)&(pIVar10->ClipRect).x == *(char *)&(pIVar14->ClipRect).x);
    auVar26[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.x + 1));
    auVar26[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.x + 2));
    auVar26[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.x + 3));
    auVar26[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar12[lVar13 + -1].ClipRect.y);
    auVar26[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.y + 1));
    auVar26[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.y + 2));
    auVar26[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.y + 3));
    auVar26[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar12[lVar13 + -1].ClipRect.z);
    auVar26[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.z + 1));
    auVar26[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.z + 2));
    auVar26[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.z + 3));
    auVar26[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar12[lVar13 + -1].ClipRect.w);
    auVar26[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.w + 1));
    auVar26[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.w + 2));
    auVar26[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.w + 3));
    auVar24[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar12[lVar13 + -1].ClipRect.w);
    auVar24[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.w + 1));
    auVar24[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.w + 2));
    auVar24[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].ClipRect.w + 3));
    auVar24[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar12[lVar13 + -1].TextureId);
    auVar24[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 1));
    auVar24[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 2));
    auVar24[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 3));
    auVar24[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 4));
    auVar24[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 5));
    auVar24[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 6));
    auVar24[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].TextureId + 7));
    auVar24[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset == (char)pIVar12[lVar13 + -1].VtxOffset
                    );
    auVar24[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].VtxOffset + 1));
    auVar24[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].VtxOffset + 2));
    auVar24[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar12[lVar13 + -1].VtxOffset + 3));
    auVar24 = auVar24 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}